

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_select(container_t *c,uint8_t type,uint32_t *start_rank,uint32_t rank,
                      uint32_t *element)

{
  run_container_t *container;
  uint32_t in_ECX;
  uint32_t *in_RDX;
  uint8_t in_SIL;
  container_t *in_RDI;
  uint32_t *in_R8;
  uint32_t *unaff_retaddr;
  undefined4 in_stack_00000010;
  undefined7 in_stack_ffffffffffffffe8;
  _Bool local_1;
  
  container = (run_container_t *)container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  if (in_SIL == '\x01') {
    local_1 = bitset_container_select
                        ((bitset_container_t *)start_rank,
                         (uint32_t *)CONCAT44(rank,in_stack_00000010),element._4_4_,unaff_retaddr);
  }
  else if (in_SIL == '\x02') {
    local_1 = array_container_select
                        ((array_container_t *)CONCAT17(2,in_stack_ffffffffffffffe8),in_RDX,in_ECX,
                         in_R8);
  }
  else {
    local_1 = run_container_select(container,in_RDX,in_ECX,in_R8);
  }
  return local_1;
}

Assistant:

static inline bool container_select(const container_t *c, uint8_t type,
                                    uint32_t *start_rank, uint32_t rank,
                                    uint32_t *element) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_select(const_CAST_bitset(c), start_rank,
                                           rank, element);
        case ARRAY_CONTAINER_TYPE:
            return array_container_select(const_CAST_array(c), start_rank, rank,
                                          element);
        case RUN_CONTAINER_TYPE:
            return run_container_select(const_CAST_run(c), start_rank, rank,
                                        element);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return false;
}